

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

void __thiscall
QTreeViewPrivate::insertViewItems(QTreeViewPrivate *this,int pos,int count,QTreeViewItem *viewItem)

{
  int iVar1;
  pointer pQVar2;
  long lVar3;
  qsizetype qVar4;
  int in_EDX;
  int in_ESI;
  qsizetype in_RDI;
  int i;
  QTreeViewItem *items;
  parameter_type in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  QList<QTreeViewItem> *in_stack_ffffffffffffffd8;
  
  QList<QTreeViewItem>::insert
            (in_stack_ffffffffffffffd8,CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)
             ,in_RDI,in_stack_ffffffffffffffc0);
  pQVar2 = QList<QTreeViewItem>::data((QList<QTreeViewItem> *)in_stack_ffffffffffffffc0);
  iVar1 = in_ESI + in_EDX;
  while( true ) {
    lVar3 = (long)iVar1;
    qVar4 = QList<QTreeViewItem>::size((QList<QTreeViewItem> *)(in_RDI + 0x5a0));
    if (qVar4 <= lVar3) break;
    if (in_ESI <= pQVar2[iVar1].parentItem) {
      pQVar2[iVar1].parentItem = in_EDX + pQVar2[iVar1].parentItem;
    }
    iVar1 = iVar1 + 1;
  }
  return;
}

Assistant:

void QTreeViewPrivate::insertViewItems(int pos, int count, const QTreeViewItem &viewItem)
{
    viewItems.insert(pos, count, viewItem);
    QTreeViewItem *items = viewItems.data();
    for (int i = pos + count; i < viewItems.size(); i++)
        if (items[i].parentItem >= pos)
            items[i].parentItem += count;
}